

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dont_underflow_cpp.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar4;
  string str;
  allocator<char> local_29;
  long *local_28;
  ulong local_20;
  long local_18 [2];
  ulong uVar3;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,argv[1],&local_29);
  uVar3 = local_20;
  if (local_20 == 0) {
LAB_001011fd:
    uVar2 = 0xffffffffffffffff;
  }
  else {
    do {
      uVar2 = uVar3 - 1;
      if (uVar3 == 0) goto LAB_001011fd;
      lVar1 = uVar3 - 1;
      uVar3 = uVar2;
    } while (*(char *)((long)local_28 + lVar1) != ':');
  }
  if (uVar2 != 0xffffffffffffffff) {
    if (local_20 <= uVar2) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if (local_28 != local_18) {
        operator_delete(local_28,local_18[0] + 1);
      }
      _Unwind_Resume(uVar4);
    }
    *(undefined1 *)((long)local_28 + uVar2 + 1) = 0;
    local_20 = uVar2 + 1;
  }
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  std::string str = argv[1];
  size_t pos = str.find_last_of(':');
  if (pos != std::string::npos)
    str.erase(pos + 1);
}